

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::remove_attribute(xml_node *this,xml_attribute *a)

{
  xml_attribute_struct *a_00;
  xml_allocator *alloc;
  xml_attribute_struct *local_28;
  xml_attribute_struct *attr;
  xml_attribute *a_local;
  xml_node *this_local;
  
  if ((this->_root == (xml_node_struct *)0x0) || (a->_attr == (xml_attribute_struct *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = a->_attr;
    while (local_28->prev_attribute_c->next_attribute != (xml_attribute_struct *)0x0) {
      local_28 = local_28->prev_attribute_c;
    }
    if (local_28 == this->_root->first_attribute) {
      if (a->_attr->next_attribute == (xml_attribute_struct *)0x0) {
        if (this->_root->first_attribute != (xml_attribute_struct *)0x0) {
          this->_root->first_attribute->prev_attribute_c = a->_attr->prev_attribute_c;
        }
      }
      else {
        a->_attr->next_attribute->prev_attribute_c = a->_attr->prev_attribute_c;
      }
      if (a->_attr->prev_attribute_c->next_attribute == (xml_attribute_struct *)0x0) {
        this->_root->first_attribute = a->_attr->next_attribute;
      }
      else {
        a->_attr->prev_attribute_c->next_attribute = a->_attr->next_attribute;
      }
      a_00 = a->_attr;
      alloc = impl::anon_unknown_0::get_allocator(this->_root);
      impl::anon_unknown_0::destroy_attribute(a_00,alloc);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

PUGI__FN bool xml_node::remove_attribute(const xml_attribute& a)
	{
		if (!_root || !a._attr) return false;

		// check that attribute belongs to *this
		xml_attribute_struct* attr = a._attr;

		while (attr->prev_attribute_c->next_attribute) attr = attr->prev_attribute_c;

		if (attr != _root->first_attribute) return false;

		if (a._attr->next_attribute) a._attr->next_attribute->prev_attribute_c = a._attr->prev_attribute_c;
		else if (_root->first_attribute) _root->first_attribute->prev_attribute_c = a._attr->prev_attribute_c;
		
		if (a._attr->prev_attribute_c->next_attribute) a._attr->prev_attribute_c->next_attribute = a._attr->next_attribute;
		else _root->first_attribute = a._attr->next_attribute;

		impl::destroy_attribute(a._attr, impl::get_allocator(_root));

		return true;
	}